

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O1

void UpdateJoystickMenu(IJoystickConfig *selected)

{
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  FOptionMenuDescriptor *this_00;
  PClass *pPVar1;
  DMenu *pDVar2;
  long *plVar3;
  uint uVar4;
  int iVar5;
  char *in_RAX;
  long *plVar6;
  FOptionMenuItemOption *this_01;
  FOptionMenuItem *pFVar7;
  FOptionMenuItemJoyConfigMenu *this_02;
  undefined4 extraout_var;
  PClass *pPVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  FString local_38;
  
  local_38.Chars._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  plVar3 = (long *)((long)&(MenuDescriptors.Nodes)->Next +
                   (ulong)((MenuDescriptors.Size - 1 & 0x21a) * 0x18));
  do {
    plVar6 = plVar3;
    if ((plVar6 == (long *)0x0) || ((long *)*plVar6 == (long *)0x1)) {
      plVar6 = (long *)0x0;
      break;
    }
    plVar3 = (long *)*plVar6;
  } while ((int)plVar6[1] != 0x21a);
  if ((plVar6 != (long *)0x0) &&
     (this_00 = (FOptionMenuDescriptor *)plVar6[2], (this_00->super_FMenuDescriptor).mType == 1)) {
    this = &this_00->mItems;
    if ((this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count == 0) {
      bVar13 = true;
    }
    else {
      uVar12 = 0;
      local_38.Chars = in_RAX;
      do {
        pFVar7 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar12];
        if (pFVar7 != (FOptionMenuItem *)0x0) {
          (*(pFVar7->super_FListMenuItem)._vptr_FListMenuItem[1])();
        }
        uVar12 = uVar12 + 1;
        uVar11 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      } while (uVar12 < uVar11);
      bVar13 = uVar11 == 0;
    }
    if (!bVar13) {
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = 0;
    }
    I_GetJoysticks(&Joysticks);
    uVar11 = Joysticks.Count - 1;
    if (selected != (IJoystickConfig *)0x0 && Joysticks.Count != 0) {
      uVar12 = 0;
      do {
        if (Joysticks.Array[uVar12] == selected) {
          uVar11 = (uint)uVar12;
          break;
        }
        uVar12 = uVar12 + 1;
      } while (Joysticks.Count != uVar12);
    }
    this_01 = (FOptionMenuItemOption *)operator_new(0x40);
    FOptionMenuItemOption::FOptionMenuItemOption
              (this_01,"Enable controller support","use_joystick","YesNo",(char *)0x0,0);
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
    uVar4 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar4] =
         (FOptionMenuItem *)this_01;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar4 + 1;
    pFVar7 = (FOptionMenuItem *)operator_new(0x28);
    local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
    FOptionMenuItem::FOptionMenuItem(pFVar7," ",(FName *)&local_38,true);
    (pFVar7->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_006f0a50
    ;
    *(EColorRange *)&pFVar7->field_0x24 = OptionSettings.mFontColor;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
    uVar4 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar4] = pFVar7;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar4 + 1;
    uVar4 = Joysticks.Count;
    pFVar7 = (FOptionMenuItem *)operator_new(0x28);
    if (uVar4 == 0) {
      local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
      FOptionMenuItem::FOptionMenuItem(pFVar7,"No controllers detected",(FName *)&local_38,true);
      (pFVar7->super_FListMenuItem)._vptr_FListMenuItem =
           (_func_int **)&PTR__FOptionMenuItem_006f0a50;
      *(EColorRange *)&pFVar7->field_0x24 = OptionSettings.mFontColor;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
      uVar11 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar11] = pFVar7;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar11 + 1;
      if (use_joystick.Value == false) {
        pFVar7 = (FOptionMenuItem *)operator_new(0x28);
        local_38.Chars = local_38.Chars & 0xffffffff00000000;
        FOptionMenuItem::FOptionMenuItem
                  (pFVar7,"Controller support must be",(FName *)&local_38,true);
        (pFVar7->super_FListMenuItem)._vptr_FListMenuItem =
             (_func_int **)&PTR__FOptionMenuItem_006f0a50;
        *(EColorRange *)&pFVar7->field_0x24 = OptionSettings.mFontColor;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
        uVar11 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
        (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar11] = pFVar7;
        (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar11 + 1;
        pFVar7 = (FOptionMenuItem *)operator_new(0x28);
        local_38.Chars = local_38.Chars & 0xffffffff00000000;
        FOptionMenuItem::FOptionMenuItem(pFVar7,"enabled to detect any",(FName *)&local_38,true);
        (pFVar7->super_FListMenuItem)._vptr_FListMenuItem =
             (_func_int **)&PTR__FOptionMenuItem_006f0a50;
        *(EColorRange *)&pFVar7->field_0x24 = OptionSettings.mFontColor;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
        uVar11 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
        (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar11] = pFVar7;
        (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar11 + 1;
      }
    }
    else {
      local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
      FOptionMenuItem::FOptionMenuItem(pFVar7,"Configure controllers:",(FName *)&local_38,true);
      (pFVar7->super_FListMenuItem)._vptr_FListMenuItem =
           (_func_int **)&PTR__FOptionMenuItem_006f0a50;
      *(EColorRange *)&pFVar7->field_0x24 = OptionSettings.mFontColor;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
      uVar4 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar4] = pFVar7;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar4 + 1;
      if (0 < (int)Joysticks.Count) {
        uVar12 = 0;
        do {
          this_02 = (FOptionMenuItemJoyConfigMenu *)operator_new(0x30);
          (*Joysticks.Array[uVar12]->_vptr_IJoystickConfig[2])(&local_38);
          FOptionMenuItemJoyConfigMenu::FOptionMenuItemJoyConfigMenu
                    (this_02,local_38.Chars,Joysticks.Array[uVar12]);
          FString::~FString(&local_38);
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar4 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar4] =
               (FOptionMenuItem *)this_02;
          uVar4 = uVar4 + 1;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar4;
          if (uVar11 == uVar12) {
            this_00->mSelectedItem = uVar4;
          }
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)(int)Joysticks.Count);
      }
    }
    uVar11 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    if ((int)uVar11 <= this_00->mSelectedItem) {
      this_00->mSelectedItem = uVar11 - 1;
    }
    FOptionMenuDescriptor::CalcIndent(this_00);
    pDVar2 = DMenu::CurrentMenu;
    pPVar1 = DJoystickConfigMenu::RegistrationInfo.MyClass;
    uVar12 = (ulong)Joysticks.Count;
    if (uVar12 == 0) {
      uVar10 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar10 = uVar9;
        if (Joysticks.Array[uVar9] == SELECTED_JOYSTICK) break;
        uVar9 = uVar9 + 1;
        uVar10 = uVar12;
      } while (uVar12 != uVar9);
    }
    if (((uint)uVar10 == Joysticks.Count) &&
       (SELECTED_JOYSTICK = (IJoystickConfig *)0x0, DMenu::CurrentMenu != (DMenu *)0x0)) {
      if ((DMenu::CurrentMenu->super_DObject).Class == (PClass *)0x0) {
        iVar5 = (**(DMenu::CurrentMenu->super_DObject)._vptr_DObject)(DMenu::CurrentMenu);
        (pDVar2->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar8 = (pDVar2->super_DObject).Class;
      bVar13 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar1 && bVar13) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar13 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar1) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (bVar13) {
        (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xd])();
      }
    }
  }
  return;
}

Assistant:

void UpdateJoystickMenu(IJoystickConfig *selected)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickOptions);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
		}
		opt->mItems.Clear();

		int i;
		int itemnum = -1;

		I_GetJoysticks(Joysticks);
		if ((unsigned)itemnum >= Joysticks.Size())
		{
			itemnum = Joysticks.Size() - 1;
		}
		if (selected != NULL)
		{
			for (i = 0; (unsigned)i < Joysticks.Size(); ++i)
			{
				if (Joysticks[i] == selected)
				{
					itemnum = i;
					break;
				}
			}
		}

		// Todo: Block joystick for changing this one.
		it = new FOptionMenuItemOption("Enable controller support", "use_joystick", "YesNo", NULL, false);
		opt->mItems.Push(it);
		#ifdef _WIN32
			it = new FOptionMenuItemOption("Enable DirectInput controllers", "joy_dinput", "YesNo", NULL, false);
			opt->mItems.Push(it);
			it = new FOptionMenuItemOption("Enable XInput controllers", "joy_xinput", "YesNo", NULL, false);
			opt->mItems.Push(it);
			it = new FOptionMenuItemOption("Enable raw PlayStation 2 adapters", "joy_ps2raw", "YesNo", NULL, false);
			opt->mItems.Push(it);
		#endif

		it = new FOptionMenuItemStaticText(" ", false);
		opt->mItems.Push(it);

		if (Joysticks.Size() == 0)
		{
			it = new FOptionMenuItemStaticText("No controllers detected", false);
			opt->mItems.Push(it);
			if (!use_joystick)
			{
				it = new FOptionMenuItemStaticText("Controller support must be", false);
				opt->mItems.Push(it);
				it = new FOptionMenuItemStaticText("enabled to detect any", false);
				opt->mItems.Push(it);
			}
		}
		else
		{
			it = new FOptionMenuItemStaticText("Configure controllers:", false);
			opt->mItems.Push(it);

			for (int i = 0; i < (int)Joysticks.Size(); ++i)
			{
				it = new FOptionMenuItemJoyConfigMenu(Joysticks[i]->GetName(), Joysticks[i]);
				opt->mItems.Push(it);
				if (i == itemnum) opt->mSelectedItem = opt->mItems.Size();
			}
		}
		if (opt->mSelectedItem >= (int)opt->mItems.Size())
		{
			opt->mSelectedItem = opt->mItems.Size() - 1;
		}

		opt->CalcIndent();

		// If the joystick config menu is open, close it if the device it's
		// open for is gone.
		for (i = 0; (unsigned)i < Joysticks.Size(); ++i)
		{
			if (Joysticks[i] == SELECTED_JOYSTICK)
			{
				break;
			}
		}
		if (i == (int)Joysticks.Size())
		{
			SELECTED_JOYSTICK = NULL;
			if (DMenu::CurrentMenu != NULL && DMenu::CurrentMenu->IsKindOf(RUNTIME_CLASS(DJoystickConfigMenu)))
			{
				DMenu::CurrentMenu->Close();
			}
		}
	}
}